

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

void __thiscall google::FlagSaverImpl::~FlagSaverImpl(FlagSaverImpl *this)

{
  CommandLineFlag *this_00;
  bool bVar1;
  reference ppCVar2;
  __normal_iterator<google::(anonymous_namespace)::CommandLineFlag_**,_std::vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>_>
  local_30;
  __normal_iterator<google::(anonymous_namespace)::CommandLineFlag_**,_std::vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>_>
  local_28;
  CommandLineFlag **local_20;
  __normal_iterator<google::(anonymous_namespace)::CommandLineFlag_*const_*,_std::vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>_>
  local_18;
  const_iterator it;
  FlagSaverImpl *this_local;
  
  it._M_current = (CommandLineFlag **)this;
  __gnu_cxx::
  __normal_iterator<google::(anonymous_namespace)::CommandLineFlag_*const_*,_std::vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>_>
  ::__normal_iterator(&local_18);
  local_28._M_current =
       (CommandLineFlag **)
       std::
       vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
       ::begin(&this->backup_registry_);
  __gnu_cxx::
  __normal_iterator<google::(anonymous_namespace)::CommandLineFlag*const*,std::vector<google::(anonymous_namespace)::CommandLineFlag*,std::allocator<google::(anonymous_namespace)::CommandLineFlag*>>>
  ::__normal_iterator<google::(anonymous_namespace)::CommandLineFlag**>
            ((__normal_iterator<google::(anonymous_namespace)::CommandLineFlag*const*,std::vector<google::(anonymous_namespace)::CommandLineFlag*,std::allocator<google::(anonymous_namespace)::CommandLineFlag*>>>
              *)&local_20,&local_28);
  local_18._M_current = local_20;
  while( true ) {
    local_30._M_current =
         (CommandLineFlag **)
         std::
         vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
         ::end(&this->backup_registry_);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_30);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<google::(anonymous_namespace)::CommandLineFlag_*const_*,_std::vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppCVar2;
    if (this_00 != (CommandLineFlag *)0x0) {
      anon_unknown_1::CommandLineFlag::~CommandLineFlag(this_00);
      operator_delete(this_00);
    }
    __gnu_cxx::
    __normal_iterator<google::(anonymous_namespace)::CommandLineFlag_*const_*,_std::vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>_>
    ::operator++(&local_18);
  }
  std::
  vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
  ::~vector(&this->backup_registry_);
  return;
}

Assistant:

~FlagSaverImpl() {
    // reclaim memory from each of our CommandLineFlags
    vector<CommandLineFlag*>::const_iterator it;
    for (it = backup_registry_.begin(); it != backup_registry_.end(); ++it)
      delete *it;
  }